

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

global_object_create_result *
mjs::anon_unknown_35::make_math_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  undefined8 uVar1;
  object *poVar2;
  anon_class_1_0_00000001_for_f local_2b2 [18];
  gc_heap_ptr<mjs::global_object> *local_2a0;
  anon_class_16_2_21c7201e make_math_function2;
  anon_class_16_2_21c7201e make_math_function1;
  basic_string_view<char,_std::char_traits<char>_> local_258;
  string local_248;
  value local_238;
  basic_string_view<char,_std::char_traits<char>_> local_210;
  string local_200;
  value local_1f0;
  basic_string_view<char,_std::char_traits<char>_> local_1c8;
  string local_1b8;
  value local_1a8;
  basic_string_view<char,_std::char_traits<char>_> local_180;
  string local_170;
  value local_160;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  string local_128;
  value local_118;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  string local_e0;
  value local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  string local_98;
  value local_88;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  string local_50 [2];
  undefined1 local_30 [8];
  object_ptr math;
  gc_heap *h;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  math.super_gc_heap_ptr_untyped._8_8_ =
       gc_heap_ptr_untyped::heap(&global->super_gc_heap_ptr_untyped);
  gc_heap_ptr<mjs::global_object>::operator->(global);
  global_object::make_object((global_object *)local_30);
  poVar2 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_30);
  uVar1 = math.super_gc_heap_ptr_untyped._8_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,"E");
  string::string(local_50,(gc_heap *)uVar1,&local_60);
  value::value(&local_88,2.718281828459045);
  (*poVar2->_vptr_object[1])(poVar2,local_50,&local_88,7);
  value::~value(&local_88);
  string::~string(local_50);
  poVar2 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_30);
  uVar1 = math.super_gc_heap_ptr_untyped._8_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"LN10");
  string::string(&local_98,(gc_heap *)uVar1,&local_a8);
  value::value(&local_d0,2.302585092994046);
  (*poVar2->_vptr_object[1])(poVar2,&local_98,&local_d0,7);
  value::~value(&local_d0);
  string::~string(&local_98);
  poVar2 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_30);
  uVar1 = math.super_gc_heap_ptr_untyped._8_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f0,"LN2");
  string::string(&local_e0,(gc_heap *)uVar1,&local_f0);
  value::value(&local_118,0.6931471805599453);
  (*poVar2->_vptr_object[1])(poVar2,&local_e0,&local_118,7);
  value::~value(&local_118);
  string::~string(&local_e0);
  poVar2 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_30);
  uVar1 = math.super_gc_heap_ptr_untyped._8_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_138,"LOG2E");
  string::string(&local_128,(gc_heap *)uVar1,&local_138);
  value::value(&local_160,1.4426950408889634);
  (*poVar2->_vptr_object[1])(poVar2,&local_128,&local_160,7);
  value::~value(&local_160);
  string::~string(&local_128);
  poVar2 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_30);
  uVar1 = math.super_gc_heap_ptr_untyped._8_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_180,"LOG10E");
  string::string(&local_170,(gc_heap *)uVar1,&local_180);
  value::value(&local_1a8,0.4342944819032518);
  (*poVar2->_vptr_object[1])(poVar2,&local_170,&local_1a8,7);
  value::~value(&local_1a8);
  string::~string(&local_170);
  poVar2 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_30);
  uVar1 = math.super_gc_heap_ptr_untyped._8_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c8,"PI");
  string::string(&local_1b8,(gc_heap *)uVar1,&local_1c8);
  value::value(&local_1f0,3.141592653589793);
  (*poVar2->_vptr_object[1])(poVar2,&local_1b8,&local_1f0,7);
  value::~value(&local_1f0);
  string::~string(&local_1b8);
  poVar2 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_30);
  uVar1 = math.super_gc_heap_ptr_untyped._8_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_210,"SQRT1_2");
  string::string(&local_200,(gc_heap *)uVar1,&local_210);
  value::value(&local_238,0.7071067811865476);
  (*poVar2->_vptr_object[1])(poVar2,&local_200,&local_238,7);
  value::~value(&local_238);
  string::~string(&local_200);
  poVar2 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_30);
  uVar1 = math.super_gc_heap_ptr_untyped._8_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_258,"SQRT2");
  string::string(&local_248,(gc_heap *)uVar1,&local_258);
  value::value((value *)&make_math_function1.math,1.4142135623730951);
  (*poVar2->_vptr_object[1])(poVar2,&local_248,&make_math_function1.math,7);
  value::~value((value *)&make_math_function1.math);
  string::~string(&local_248);
  make_math_function2.global = (gc_heap_ptr<mjs::global_object> *)local_30;
  local_2a0 = global;
  make_math_function2.math = (object_ptr *)global;
  make_math_function1.global = make_math_function2.global;
  (anonymous_namespace)::make_math_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::
  operator()(&make_math_function2.math,"abs");
  (anonymous_namespace)::make_math_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::
  operator()(&make_math_function2.math,"acos");
  (anonymous_namespace)::make_math_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::
  operator()(&make_math_function2.math,"asin");
  (anonymous_namespace)::make_math_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::
  operator()(&make_math_function2.math,"atan");
  (anonymous_namespace)::make_math_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_5::
  operator()(&local_2a0,"atan2");
  (anonymous_namespace)::make_math_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::
  operator()(&make_math_function2.math,"ceil");
  (anonymous_namespace)::make_math_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::
  operator()(&make_math_function2.math,"cos");
  (anonymous_namespace)::make_math_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::
  operator()(&make_math_function2.math,"exp");
  (anonymous_namespace)::make_math_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::
  operator()(&make_math_function2.math,"floor");
  (anonymous_namespace)::make_math_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::
  operator()(&make_math_function2.math,"log");
  (anonymous_namespace)::make_math_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_5::
  operator()(&local_2a0,"pow");
  (anonymous_namespace)::make_math_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::
  operator()(&make_math_function2.math,"sin");
  (anonymous_namespace)::make_math_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::
  operator()(&make_math_function2.math,"sqrt");
  (anonymous_namespace)::make_math_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::
  operator()(&make_math_function2.math,"tan");
  (anonymous_namespace)::make_math_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_5::
  operator()(&local_2a0,"min");
  (anonymous_namespace)::make_math_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_5::
  operator()(&local_2a0,"max");
  (anonymous_namespace)::make_math_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::
  operator()(&make_math_function2.math,"round");
  put_native_function<mjs::(anonymous_namespace)::make_math_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__19>
            (global,(object_ptr *)local_30,"random",local_2b2,0);
  gc_heap_ptr<mjs::object>::gc_heap_ptr
            (&__return_storage_ptr__->obj,(gc_heap_ptr<mjs::object> *)local_30);
  gc_heap_ptr<mjs::object>::gc_heap_ptr(&__return_storage_ptr__->prototype,(nullptr_t)0x0);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

global_object_create_result make_math_object(const gc_heap_ptr<global_object>& global) {
    auto& h = global.heap();
    auto math = global->make_object();

    math->put(string{h, "E"},       value{2.7182818284590452354},  global_object::prototype_attributes);
    math->put(string{h, "LN10"},    value{2.302585092994046},      global_object::prototype_attributes);
    math->put(string{h, "LN2"},     value{0.6931471805599453},     global_object::prototype_attributes);
    math->put(string{h, "LOG2E"},   value{1.4426950408889634},     global_object::prototype_attributes);
    math->put(string{h, "LOG10E"},  value{0.4342944819032518},     global_object::prototype_attributes);
    math->put(string{h, "PI"},      value{3.14159265358979323846}, global_object::prototype_attributes);
    math->put(string{h, "SQRT1_2"}, value{0.7071067811865476},     global_object::prototype_attributes);
    math->put(string{h, "SQRT2"},   value{1.4142135623730951},     global_object::prototype_attributes);


    auto make_math_function1 = [&](const char* name, auto f) {
        put_native_function(global, math, name, [f](const value&, const std::vector<value>& args){
            return value{f(to_number(get_arg(args, 0)))};
        }, 1);
    };
    auto make_math_function2 = [&](const char* name, auto f) {
        put_native_function(global, math, name, [f](const value&, const std::vector<value>& args){
            return value{f(to_number(get_arg(args, 0)), to_number(get_arg(args, 1)))};
        }, 2);
    };

#define MATH_IMPL_1(name) make_math_function1(#name, [](double x) { return std::name(x); })
#define MATH_IMPL_2(name) make_math_function2(#name, [](double x, double y) { return std::name(x, y); })

    MATH_IMPL_1(abs);
    MATH_IMPL_1(acos);
    MATH_IMPL_1(asin);
    MATH_IMPL_1(atan);
    MATH_IMPL_2(atan2);
    MATH_IMPL_1(ceil);
    MATH_IMPL_1(cos);
    MATH_IMPL_1(exp);
    MATH_IMPL_1(floor);
    MATH_IMPL_1(log);
    MATH_IMPL_2(pow);
    MATH_IMPL_1(sin);
    MATH_IMPL_1(sqrt);
    MATH_IMPL_1(tan);

#undef MATH_IMPL_1
#undef MATH_IMPL_2

    make_math_function2("min", [](double x, double y) {
        return y >= x ? x: y;
    });
    make_math_function2("max", [](double x, double y) {
        return y < x ? x: y;
    });
    make_math_function1("round", [](double x) {
        if (x >= 0 && x < 0.5) return +0.0;
        if (x < 0 && x >= -0.5) return -0.0;
        return std::floor(x+0.5);
    });

    put_native_function(global, math, "random", [](const value&, const std::vector<value>&){
        return value{static_cast<double>(rand()) / (1.+RAND_MAX)};
    }, 0);

    return { math, nullptr };
}